

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O2

int recvMax(void *buf,int bufsize,int sent)

{
  uint uVar1;
  size_t __n;
  uint8_t scratch [4096];
  undefined1 auStack_1028 [4096];
  
  if (sent < bufsize) {
    bufsize = sent;
  }
  if (bufsize != 0) {
    recv(gPigCommand,buf,(long)bufsize,0x100);
  }
  for (uVar1 = sent - bufsize; uVar1 != 0; uVar1 = uVar1 - (int)__n) {
    __n = 0x1000;
    if (uVar1 < 0x1000) {
      __n = (size_t)uVar1;
    }
    recv(gPigCommand,auStack_1028,__n,0x100);
  }
  return bufsize;
}

Assistant:

int recvMax(void *buf, int bufsize, int sent)
{
   uint8_t scratch[4096];
   int remaining, fetch, count;

   if (sent < bufsize) count = sent; else count = bufsize;

   if (count) recv(gPigCommand, buf, count, MSG_WAITALL);

   remaining = sent - count;

   while (remaining)
   {
      fetch = remaining;
      if (fetch > sizeof(scratch)) fetch = sizeof(scratch);
      recv(gPigCommand, scratch, fetch, MSG_WAITALL);
      remaining -= fetch;
   }

   return count;
}